

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermAggregate * __thiscall
glslang::TIntermediate::mergeAggregate(TIntermediate *this,TIntermNode *left,TIntermNode *right)

{
  int iVar1;
  TOperator TVar2;
  int iVar3;
  undefined4 extraout_var;
  TIntermAggregate *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  iterator __first;
  undefined4 extraout_var_06;
  iterator __last;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_48;
  const_iterator local_40;
  TIntermOperator *local_38;
  TIntermAggregate *rhsagg;
  TIntermAggregate *aggNode;
  TIntermNode *right_local;
  TIntermNode *left_local;
  TIntermediate *this_local;
  
  if ((left == (TIntermNode *)0x0) && (right == (TIntermNode *)0x0)) {
    this_local = (TIntermediate *)0x0;
  }
  else {
    rhsagg = (TIntermAggregate *)0x0;
    aggNode = (TIntermAggregate *)right;
    right_local = left;
    left_local = (TIntermNode *)this;
    if (left != (TIntermNode *)0x0) {
      iVar1 = (*left->_vptr_TIntermNode[6])();
      rhsagg = (TIntermAggregate *)CONCAT44(extraout_var,iVar1);
    }
    if ((rhsagg == (TIntermAggregate *)0x0) ||
       (TVar2 = TIntermOperator::getOp(&rhsagg->super_TIntermOperator), TVar2 != EOpNull)) {
      this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)left);
      TIntermAggregate::TIntermAggregate(this_00);
      rhsagg = this_00;
      if (right_local != (TIntermNode *)0x0) {
        iVar1 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                  ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                   CONCAT44(extraout_var_00,iVar1),&right_local);
      }
    }
    iVar1 = (*(aggNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[6])();
    local_38 = (TIntermOperator *)CONCAT44(extraout_var_01,iVar1);
    if ((local_38 == (TIntermOperator *)0x0) ||
       (TVar2 = TIntermOperator::getOp(local_38), TVar2 != EOpNull)) {
      iVar1 = (*(rhsagg->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                 CONCAT44(extraout_var_02,iVar1),(value_type *)&aggNode);
    }
    else {
      iVar1 = (*(rhsagg->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      iVar3 = (*(rhsagg->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      local_48._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var_04,iVar3));
      __gnu_cxx::
      __normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
      ::__normal_iterator<TIntermNode**>
                ((__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>
                  *)&local_40,&local_48);
      iVar3 = (*(local_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      __first = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_05,iVar3));
      iVar3 = (*(local_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      __last = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          CONCAT44(extraout_var_06,iVar3));
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
      insert<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,void>
                ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                 CONCAT44(extraout_var_03,iVar1),local_40,
                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                  )__last._M_current);
    }
    this_local = (TIntermediate *)rhsagg;
  }
  return (TIntermAggregate *)this_local;
}

Assistant:

TIntermAggregate* TIntermediate::mergeAggregate(TIntermNode* left, TIntermNode* right)
{
    if (left == nullptr && right == nullptr)
        return nullptr;

    TIntermAggregate* aggNode = nullptr;
    if (left != nullptr)
        aggNode = left->getAsAggregate();
    if (aggNode == nullptr || aggNode->getOp() != EOpNull) {
        aggNode = new TIntermAggregate;
        if (left != nullptr)
            aggNode->getSequence().push_back(left);
    }

    TIntermAggregate* rhsagg = right->getAsAggregate();
    if (rhsagg == nullptr || rhsagg->getOp() != EOpNull)
        aggNode->getSequence().push_back(right);
    else
        aggNode->getSequence().insert(aggNode->getSequence().end(),
                                      rhsagg->getSequence().begin(),
                                      rhsagg->getSequence().end());

    return aggNode;
}